

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,char_const*,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,char *significand,
          int significand_size,int exponent,digit_grouping<wchar_t> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  memory_buffer buffer;
  char local_231;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    bVar1 = write_significand<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      (out,significand,significand_size);
    local_230.super_buffer<char>._vptr_buffer =
         (_func_int **)CONCAT44(local_230.super_buffer<char>._vptr_buffer._4_4_,0x30);
    bVar1 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,wchar_t>
                      (bVar1,exponent,(wchar_t *)&local_230);
  }
  else {
    local_230.super_buffer<char>.ptr_ = local_230.store_;
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001e6920;
    local_230.super_buffer<char>.capacity_ = 500;
    write_significand<char,fmt::v8::appender>((appender)&local_230,significand,significand_size);
    local_231 = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_230,exponent,&local_231);
    digits.size_ = local_230.super_buffer<char>.size_;
    digits.data_ = local_230.super_buffer<char>.ptr_;
    bVar1 = digit_grouping<wchar_t>::
            apply<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,char>
                      (grouping,out,digits);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_230);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}